

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void lexer_DumpStringExpansions(void)

{
  Expansion *pEVar1;
  
  if (lexerState != (LexerState *)0x0) {
    pEVar1 = (Expansion *)&lexerState->expansions;
    while (pEVar1 = pEVar1->parent, pEVar1 != (Expansion *)0x0) {
      if (pEVar1->name != (char *)0x0) {
        fprintf(_stderr,"while expanding symbol \"%s\"\n");
      }
    }
  }
  return;
}

Assistant:

void lexer_DumpStringExpansions(void)
{
	if (!lexerState)
		return;

	for (struct Expansion *exp = lexerState->expansions; exp; exp = exp->parent) {
		// Only register EQUS expansions, not string args
		if (exp->name)
			fprintf(stderr, "while expanding symbol \"%s\"\n", exp->name);
	}
}